

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LE_Fire_PDU.cpp
# Opt level: O0

void __thiscall KDIS::PDU::LE_Fire_PDU::SetMunitionEntityIDFlag(LE_Fire_PDU *this,KBOOL F)

{
  KBOOL F_local;
  LE_Fire_PDU *this_local;
  
  if (F != (KBOOL)((this->m_FireFlagUnion).m_ui8Flag >> 2 & 1)) {
    (this->m_FireFlagUnion).m_ui8Flag = (this->m_FireFlagUnion).m_ui8Flag & 0xfb | F << 2;
    if (F) {
      (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength =
           (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength + 2;
    }
    else {
      (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength =
           (this->super_LE_Header).super_Header.super_Header6.m_ui16PDULength - 2;
    }
  }
  return;
}

Assistant:

void LE_Fire_PDU::SetMunitionEntityIDFlag( KBOOL F )
{
    if( ( KUINT8 )F == m_FireFlagUnion.m_ui8MunitionId )return;

    m_FireFlagUnion.m_ui8MunitionId = F;

    if( F )
    {
        m_ui16PDULength += 2; // 2 = This flag only indicates the entity id field is included.
    }
    else
    {
        m_ui16PDULength -= 2;
    }
}